

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::DecodeLockingScript::DecodeLockingScript(DecodeLockingScript *this)

{
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  DecodeLockingScript *local_10;
  DecodeLockingScript *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::DecodeLockingScript>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::DecodeLockingScript>);
  (this->super_JsonClassBase<cfd::js::api::json::DecodeLockingScript>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodeLockingScript_01b3b318;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->asm__,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->hex_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  this->req_sigs_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->type_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->addresses_);
  CollectFieldName();
  return;
}

Assistant:

DecodeLockingScript() {
    CollectFieldName();
  }